

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

CommandSignature __thiscall
anon_unknown.dwarf_145302::SymlinkCommand::getSignature(SymlinkCommand *this)

{
  bool bVar1;
  const_reference ppBVar2;
  CommandSignature *pCVar3;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  reference ppBVar4;
  StringRef SVar5;
  BuildNode *input;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range2;
  SymlinkCommand *this_local;
  CommandSignature code;
  
  ppBVar2 = std::
            vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ::operator[](&(this->super_Command).outputs,0);
  SVar5 = llbuild::buildsystem::Node::getName(&(*ppBVar2)->super_Node);
  llbuild::basic::CommandSignature::CommandSignature((CommandSignature *)&this_local,SVar5);
  pCVar3 = llbuild::basic::CommandSignature::combine
                     ((CommandSignature *)&this_local,&this->contents);
  this_local = (SymlinkCommand *)pCVar3->value;
  this_00 = &(this->super_Command).inputs;
  __end2 = std::
           vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ::begin(this_00);
  input = (BuildNode *)
          std::
          vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                *)&input);
    if (!bVar1) break;
    ppBVar4 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
              ::operator*(&__end2);
    SVar5 = llbuild::buildsystem::Node::getName(&(*ppBVar4)->super_Node);
    pCVar3 = llbuild::basic::CommandSignature::combine((CommandSignature *)&this_local,SVar5);
    this_local = (SymlinkCommand *)pCVar3->value;
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
    ::operator++(&__end2);
  }
  return (CommandSignature)(uint64_t)this_local;
}

Assistant:

virtual CommandSignature getSignature() const override {
    CommandSignature code(outputs[0]->getName());
    code = code.combine(contents);
    for (const auto* input: inputs) {
      code = code.combine(input->getName());
    }
    return code;
  }